

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

void nh_stream_copy(nh_stream_t *stream,char *src,uint32_t size)

{
  uint uVar1;
  char *__ptr;
  uint uVar2;
  
  uVar2 = stream->length;
  uVar1 = uVar2 + size;
  __ptr = stream->buf;
  if (stream->capacity < uVar1) {
    stream->capacity = uVar1;
    __ptr = (char *)realloc(__ptr,(ulong)uVar1);
    stream->buf = __ptr;
    if (__ptr == (char *)0x0) {
      __assert_fail("stream->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                    ,0x168,"void nh_stream_copy(nh_stream_t *, const char *, uint32_t)");
    }
    uVar2 = stream->length;
  }
  memcpy(__ptr + uVar2,src,(ulong)size);
  stream->length = stream->length + size;
  return;
}

Assistant:

void nh_stream_copy(nh_stream_t *stream, char const src[static 1], uint32_t size) {
    if (stream->length + size > stream->capacity) {
        stream->capacity = stream->length + size;
        stream->buf = (char *) realloc(stream->buf, stream->capacity);
        assert(stream->buf != NULL);
    }
    memcpy(stream->buf + stream->length, src, size);
    stream->length += size;
}